

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O0

int ReadSymTab(char *label)

{
  int iVar1;
  SymTab **ppSVar2;
  SymTab **hashindex;
  char local_98 [2];
  char wnum [6];
  char wlab [128];
  char *label_local;
  
  strcpy(local_98,label);
  if ((('/' < *label) && (*label < ':')) || (*label == '\\')) {
    if (*label == '\\') {
      strcat(local_98,"$");
    }
    sprintf((char *)((long)&hashindex + 2),"%d",(ulong)(uint)LabLine);
    strcat(local_98,(char *)((long)&hashindex + 2));
  }
  ppSVar2 = HashIt(local_98);
  Sym = *ppSVar2;
  while( true ) {
    if (Sym == (SymTab *)0x0) {
      Value = 0;
      DefLine2 = 0x7fff;
      Hunk2 = 0x7fff;
      return 0;
    }
    iVar1 = strcmp(Sym->Nam,local_98);
    if (iVar1 == 0) break;
    Sym = Sym->Link;
  }
  Hunk2 = Sym->Hunk;
  if ((Sym->Flags & 9U) == 0) {
    Hunk2 = Hunk2 & 0xffff;
  }
  DefLine2 = Sym->Defn;
  Value = Sym->Val;
  return 1;
}

Assistant:

int ReadSymTab(label)
	char label[];
/* Searches the symbol table for the given label.
 If not found, points Sym to NULL and returns FALSE.
 If found, points Sym to the proper table entry,
 and sets up the following fields:
 Value    - value of symbol
 Hunk2    - hunk number in which symbol resides
 ABSHUNK if value is absolute
 ones complement of symbol table index if external
 DefLine2 - statement number in which symbol was defined
 (NODEF if undefined )
 If the label is a local label (i.e. the first character is
 numeric), the current contents of LabLine will be converted
 to characters and appended to the label before it is searched.
 (This matches the way AddSymTab added the label to the table.)
 If the first character of the label is a backslash (i.e. a
 named local variable) a dollar sign will be appended to the
 label ahead of the value of LabLine.                       */
{
	char wlab[MAXLINE], wnum[6];
	register struct SymTab **hashindex;

	strcpy(wlab, label);
	if (((label[0] >= '0') && (label[0] <= '9')) || (label[0] == '\\')) {
		if (label[0] == '\\')
			strcat(wlab, "$");
		sprintf(wnum, "%d", LabLine); /* If it's a local label, */
		strcat(wlab, wnum); /*    append LabLine.     */
	}
	hashindex = HashIt(wlab); /* Get hash index. */
	Sym = *hashindex;
	while (Sym != NULL) {
		if (strcmp(Sym->Nam, wlab) == 0) {
			Value = Sym->Val; /* We found it. */
			Hunk2 = Sym->Hunk;
			if (!(Sym->Flags & 9))
				Hunk2 &= 0x0000FFFFL; /* Isolate hunk number. */
			DefLine2 = Sym->Defn;
			return (TRUE);
		}
		Sym = Sym->Link;
	}
	Value = 0; /* We didn't find it - */
	Hunk2 = ABSHUNK; /*  set value to absolute zero. */
	DefLine2 = NODEF;
	return (FALSE);
}